

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<const_char_*> __thiscall asl::Array<asl::String>::with<char_const*>(Array<asl::String> *this)

{
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  long *in_RSI;
  
  Array<const_char_*>::alloc((Array<const_char_*> *)this,*(int *)(*in_RSI + -0x10));
  lVar1 = 8;
  for (lVar2 = 0; lVar3 = *in_RSI, lVar2 < *(int *)(lVar3 + -0x10); lVar2 = lVar2 + 1) {
    if (*(int *)(lVar3 + -8 + lVar1) == 0) {
      lVar3 = lVar3 + lVar1;
    }
    else {
      lVar3 = *(long *)(lVar3 + lVar1);
    }
    *(long *)(&this->_a->_size + lVar2 * 2) = lVar3;
    lVar1 = lVar1 + 0x18;
  }
  return (Array<const_char_*>)(char **)this;
}

Assistant:

Array<K> with() const
	{
		Array<K> b(length());
		for (int i = 0; i < length(); i++)
			b[i] = (K)_a[i];
		return b;
	}